

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iarchive_std_suite.cpp
# Opt level: O2

void container_suite::run(void)

{
  test_vector_empty();
  test_vector_one();
  test_set_empty();
  test_set_one();
  deprecated_test_map_empty();
  test_map_empty();
  deprecated_test_map_one();
  test_map_one();
  return;
}

Assistant:

void run()
{
    test_vector_empty();
    test_vector_one();
    test_set_empty();
    test_set_one();
    deprecated_test_map_empty();
    test_map_empty();
    deprecated_test_map_one();
    test_map_one();
}